

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::socks5_stream::
async_connect<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (socks5_stream *this,endpoint_type *endpoint,
          _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  allocator<char> local_e1;
  _Any_data local_e0;
  _Manager_type local_d0;
  _Invoker_type p_Stack_c8;
  _Bind<void_(libtorrent::socks5_stream::*(libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::function<void_(const_boost::system::error_code_&)>)>
  local_c0;
  query q;
  
  uVar1 = *(undefined8 *)&(endpoint->impl_).data_;
  uVar2 = *(undefined8 *)((long)&(endpoint->impl_).data_ + 8);
  uVar3 = *(undefined8 *)((long)&(endpoint->impl_).data_ + 0x14);
  *(undefined8 *)((long)&(this->super_proxy_base).m_remote_endpoint.impl_.data_ + 0xc) =
       *(undefined8 *)((long)&(endpoint->impl_).data_ + 0xc);
  *(undefined8 *)((long)&(this->super_proxy_base).m_remote_endpoint.impl_.data_ + 0x14) = uVar3;
  *(undefined8 *)&(this->super_proxy_base).m_remote_endpoint.impl_.data_ = uVar1;
  *(undefined8 *)((long)&(this->super_proxy_base).m_remote_endpoint.impl_.data_ + 8) = uVar2;
  to_string((array<char,_22UL> *)&local_e0,(long)(this->super_proxy_base).m_port);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,local_e0._M_pod_data,&local_e1);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            (&q,&(this->super_proxy_base).m_hostname,(string *)&local_c0,address_configured);
  std::__cxx11::string::~string((string *)&local_c0);
  std::function<void(boost::system::error_code_const&)>::
  function<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>const,void>
            ((function<void(boost::system::error_code_const&)> *)local_e0._M_pod_data,handler);
  local_c0._M_f = (offset_in_socks5_stream_to_subr)name_lookup;
  local_c0._8_8_ = 0;
  local_c0._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  .super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_c0._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  .super__Function_base._M_functor._8_8_ = 0;
  local_c0._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  .super__Function_base._M_manager = (_Manager_type)0x0;
  local_c0._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .
  super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
  super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>._M_head_impl
  ._M_invoker = p_Stack_c8;
  if (local_d0 != (_Manager_type)0x0) {
    local_c0._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_functor._M_unused._M_object = local_e0._M_unused._M_object;
    local_c0._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_functor._8_8_ = local_e0._8_8_;
    local_c0._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<2UL,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<3UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_manager = local_d0;
    local_d0 = (_Manager_type)0x0;
    p_Stack_c8 = (_Invoker_type)0x0;
  }
  local_c0._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::socks5_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>_>
  .super__Head_base<0UL,_libtorrent::socks5_stream_*,_false>._M_head_impl = this;
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<std::_Bind<void(libtorrent::socks5_stream::*(libtorrent::socks5_stream*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&)>)>>
            ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&(this->super_proxy_base).m_resolver,&q,&local_c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_c0._M_bound_args);
  std::_Function_base::~_Function_base((_Function_base *)&local_e0);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query(&q);
  return;
}

Assistant:

void async_connect(endpoint_type const& endpoint, Handler const& handler)
	{
		// make sure we don't try to connect to INADDR_ANY. binding is fine,
		// and using a hostname is fine on SOCKS version 5.
		TORRENT_ASSERT(endpoint.address() != address()
			|| (!m_dst_name.empty() && m_version == 5));

		m_remote_endpoint = endpoint;

		// the connect is split up in the following steps:
		// 1. resolve name of proxy server
		// 2. connect to proxy server
		// 3. if version == 5:
		//   3.1 send SOCKS5 authentication method message
		//   3.2 read SOCKS5 authentication response
		//   3.3 send username+password
		// 4. send SOCKS command message

		using std::placeholders::_1;
		using std::placeholders::_2;
		ADD_OUTSTANDING_ASYNC("socks5_stream::name_lookup");
		tcp::resolver::query q(m_hostname, to_string(m_port).data());
		m_resolver.async_resolve(q, std::bind(
			&socks5_stream::name_lookup, this, _1, _2, handler_type(std::move(handler))));
	}